

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

int __thiscall
Js::
WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
::GetFreeItemIndex(WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
                   *this,List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                         *list)

{
  Type *pTVar1;
  uint uVar2;
  int index;
  
  if (((list->
       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
       ).alloc)->weakReferenceCleanupId != this->lastWeakReferenceCleanupId) {
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
    ::
    MapFrom<Js::WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>,true>::CleanupWeakReference(JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*)::_lambda(int,Memory::RecyclerWeakReference<Js::ScriptFunctionType>*)_1_>
              ((List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                *)list,0,(anon_class_8_1_898e5d9c)list);
    this->lastWeakReferenceCleanupId =
         ((list->
          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
          ).alloc)->weakReferenceCleanupId;
  }
  index = (this->
          super_FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
          ).freeItemIndex;
  if (index == -1) {
    index = -1;
  }
  else {
    pTVar1 = JsUtil::
             List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
             ::Item(list,index);
    uVar2 = *(uint *)&pTVar1->ptr >> 1;
    if (*(uint *)&pTVar1->ptr == 0xffffffff) {
      uVar2 = 0xffffffff;
    }
    (this->
    super_FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
    ).freeItemIndex = uVar2;
  }
  return index;
}

Assistant:

int GetFreeItemIndex(TListType * list)
        {
            if (list->alloc->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                CleanupWeakReference(list);
            }
            return __super::GetFreeItemIndex(list);
        }